

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# API.cpp
# Opt level: O2

void API::createIndex(IndexInfo *indexInfo)

{
  _Rb_tree_color _Var1;
  Addr p_00;
  bool bVar2;
  int iVar3;
  iterator iVar4;
  ostream *poVar5;
  Addr p;
  string filename;
  value v;
  Addr local_258;
  RecordSet *local_250;
  string local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  undefined1 local_1e8 [8];
  _Alloc_hider local_1e0;
  size_type local_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  string local_1b8;
  undefined1 local_198 [48];
  IndexInfo local_168;
  IndexInfo local_100;
  IndexInfo local_98;
  
  std::operator<<((ostream *)&std::cout,"create index ------------------\n");
  bVar2 = catalog::createIndex(&CM,indexInfo);
  if (bVar2) {
    std::__cxx11::string::string((string *)&local_1b8,(string *)&indexInfo->tableName);
    iVar3 = catalog::existTable(&CM,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&(CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[iVar3]->getID)._M_t,
                   &indexInfo->colunmName);
    _Var1 = iVar4._M_node[2]._M_color;
    indexInfo->type =
         (CM.TableInfoList.super__Vector_base<TableInfo_*,_std::allocator<TableInfo_*>_>._M_impl.
          super__Vector_impl_data._M_start[iVar3]->type).
         super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         [(int)_Var1];
    indexInfo->indexID = _Var1;
    IndexInfo::IndexInfo(&local_168,indexInfo);
    IndexManager::CreateIndexFile(&IM,&local_168);
    IndexInfo::~IndexInfo(&local_168);
    local_258.BlockNum = 1;
    local_258.FileOff = 0;
    local_1e0._M_p = (pointer)&local_1d0;
    local_1d8 = 0;
    local_1d0._M_local_buf[0] = '\0';
    std::operator+(&local_228,&RM.Direction,&indexInfo->tableName);
    std::operator+(&local_208,&local_228,"_rcd.dat");
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::string((string *)&local_248,(string *)&local_208);
    local_250 = RecordManager::FindRecordSet(&RM,&local_248);
    std::__cxx11::string::~string((string *)&local_248);
    while( true ) {
      do {
        IndexInfo::IndexInfo(&local_98,indexInfo);
        iVar3 = RecordManager::ReturnKP(&RM,&local_98,local_258,(value *)local_1e8);
        IndexInfo::~IndexInfo(&local_98);
      } while (iVar3 == 0);
      if (iVar3 == -1) break;
      IndexInfo::IndexInfo(&local_100,indexInfo);
      p_00 = local_258;
      value::value((value *)local_198,(value *)local_1e8);
      IndexManager::InsertSuchKey(&IM,&local_100,p_00,(value *)local_198);
      std::__cxx11::string::~string((string *)(local_198 + 8));
      IndexInfo::~IndexInfo(&local_100);
      RecordSet::Addp(local_250,&local_258);
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,local_258.BlockNum);
      poVar5 = std::operator<<(poVar5,"\t");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_258.FileOff);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1e0);
  }
  return;
}

Assistant:

void API::createIndex(IndexInfo *indexInfo){
    std::cout <<"create index ------------------\n";
    if(!CM.createIndex(indexInfo))return;//建立catalog索引
    int pos = CM.existTable(indexInfo->tableName);
    
    auto it = CM.TableInfoList[pos]->getID.find(indexInfo->colunmName);
    indexInfo->type = CM.TableInfoList[pos]->type[it->second];
    indexInfo->indexID = it->second;
    IM.CreateIndexFile(*indexInfo);//建立indexfile

    //将之前插入table的值插入indexfile
    Addr p = {1,0};
    struct value v;
    string filename = RM.Direction + indexInfo->tableName + "_rcd.dat";
    RecordSet& R = RM.FindRecordSet(filename);
    while(1){
        int result = RM.ReturnKP(*indexInfo,p,v);
        if(result == 0)continue;
        else if(result == -1)break;
        IM.InsertSuchKey(*indexInfo,p,v);
        R.Addp(p);
        std::cout << p.BlockNum <<"\t"<<p.FileOff<<std::endl;
    }
}